

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O2

void __thiscall
SuffixTree::GeneralizedSuffixTree::~GeneralizedSuffixTree(GeneralizedSuffixTree *this)

{
  long lVar1;
  uint i;
  ulong uVar2;
  
  puts("Clearing tree...");
  if ((this->nodes != (char *)0x0) && (this->leaves != (char *)0x0)) {
    lVar1 = 0x28;
    for (uVar2 = 0; uVar2 < this->nodes_num; uVar2 = uVar2 + 1) {
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)(this->nodes + lVar1));
      lVar1 = lVar1 + 0x60;
    }
    free(this->nodes);
    free(this->leaves);
  }
  puts("Tree was cleared successfully");
  std::
  _Vector_base<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
  ::~_Vector_base(&(this->answers).
                   super__Vector_base<std::pair<SuffixTree::Node_*,_unsigned_int>,_std::allocator<std::pair<SuffixTree::Node_*,_unsigned_int>_>_>
                 );
  std::_Vector_base<SuffixTree::Node_*,_std::allocator<SuffixTree::Node_*>_>::~_Vector_base
            (&(this->previous_suffixes).
              super__Vector_base<SuffixTree::Node_*,_std::allocator<SuffixTree::Node_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->strings);
  return;
}

Assistant:

GeneralizedSuffixTree::~GeneralizedSuffixTree()
{
    printf ("Clearing tree...\n");
    if (nodes && leaves)
    {
        for (uint i = 0; i < nodes_num; ++i)
            reinterpret_cast<Node *> (nodes + i * sizeof (Node))->~Node();
        for (uint i = 0; i < leaves_num; ++i)
            reinterpret_cast<Leaf *> (leaves + i * sizeof (Leaf))->~Leaf();
        free (nodes);
        free (leaves);
    }
    printf ("Tree was cleared successfully\n");
}